

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O2

int testFileWriterTestsWriteDataWithOffset(void)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  ostream *this;
  int iVar4;
  SpanSize<18446744073709551615UL> in_R8;
  uchar *__first2;
  pointer ptVar5;
  SpanSize<18446744073709551615UL> SVar6;
  uchar *__first1;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  Span<unsigned_char,_18446744073709551615UL> data_00;
  Span<unsigned_char,_18446744073709551615UL> data_01;
  undefined4 local_284;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  AutoDeleteTempFile tempfile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x281e140a;
  __l._M_len = 4;
  __l._M_array = (iterator)&output;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&expected,__l,(allocator_type *)&local_284);
  SVar6.m_size = (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  __first1 = (uchar *)0x0;
  if (SVar6.m_size != 0) {
    __first1 = expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)&output,psVar2,true);
  data.m_size.m_size = SVar6.m_size;
  data.m_ptr = __first1;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)&output,data,0x40);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)&output);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&output,(long)expected.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)expected.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(allocator_type *)&local_284);
  ptVar5 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)CONCAT44(output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_4_);
  __first2 = (uchar *)0x0;
  if (ptVar5 != (pointer)0x0) {
    __first2 = (uchar *)CONCAT44(output.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 output.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
  }
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  data_00.m_size.m_size = in_R8.m_size;
  data_00.m_ptr = ptVar5;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar2,(string *)0x40,(uint64_t)__first2,data_00);
  bVar1 = std::__equal4<unsigned_char*,unsigned_char*>
                    (__first1,__first1 + SVar6.m_size,__first2,__first2 + (long)ptVar5);
  if (bVar1) {
    local_284 = 0;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected);
    psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
    data_01.m_size.m_size = in_R8.m_size;
    data_01.m_ptr = ptVar5;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar2,(string *)0x0,(uint64_t)__first2,data_01);
    bVar1 = std::__equal4<unsigned_char*,unsigned_char*>
                      (__first1,__first1 + SVar6.m_size,__first2,__first2 + (long)ptVar5);
    iVar4 = 0;
    if (bVar1) goto LAB_00172acb;
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    this = (ostream *)std::operator<<(poVar3,":");
    iVar4 = 0x79;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    this = (ostream *)std::operator<<(poVar3,":");
    iVar4 = 0x74;
  }
  poVar3 = (ostream *)std::ostream::operator<<(this,iVar4);
  poVar3 = std::operator<<(poVar3,": error: ");
  poVar3 = std::operator<<(poVar3,
                           "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                          );
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 1;
LAB_00172acb:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return iVar4;
}

Assistant:

int testFileWriterTestsWriteDataWithOffset()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 64;
        std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Writer writes 0s if offset is out of current file boundry
        expected = {0, 0, 0, 0};
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    return 0;
}